

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_entry_renderer(parser *p)

{
  _Bool _Var1;
  wchar_t wVar2;
  int iVar3;
  char *name_00;
  char *pcStack_38;
  wchar_t index;
  char *symbols;
  char *label_colors;
  char *colors;
  char *name;
  parser *p_local;
  
  name_00 = parser_getsym(p,"name");
  wVar2 = ui_entry_renderer_lookup(name_00);
  if (wVar2 == L'\0') {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    _Var1 = parser_hasval(p,"colors");
    if (_Var1) {
      label_colors = parser_getsym(p,"colors");
      iVar3 = strcmp(label_colors,"*");
      if (iVar3 == 0) {
        label_colors = (char *)0x0;
      }
    }
    else {
      label_colors = (char *)0x0;
    }
    _Var1 = parser_hasval(p,"labelcolors");
    if (_Var1) {
      symbols = parser_getsym(p,"labelcolors");
      iVar3 = strcmp(symbols,"*");
      if (iVar3 == 0) {
        symbols = (char *)0x0;
      }
    }
    else {
      symbols = (char *)0x0;
    }
    _Var1 = parser_hasval(p,"symbols");
    if (_Var1) {
      pcStack_38 = parser_getsym(p,"symbols");
    }
    else {
      pcStack_38 = (char *)0x0;
    }
    wVar2 = ui_entry_renderer_customize(wVar2,label_colors,symbols,pcStack_38);
    if (wVar2 == L'\0') {
      p_local._4_4_ = PARSE_ERROR_NONE;
    }
    else {
      p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_prefs_entry_renderer(struct parser *p)
{
	const char* name = parser_getsym(p, "name");
	const char* colors;
	const char* label_colors;
	const char* symbols;
	int index;

	index = ui_entry_renderer_lookup(name);
	if (index == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	if (parser_hasval(p, "colors")) {
		colors = parser_getsym(p, "colors");
		if (streq(colors, "*")) {
			colors = NULL;
		}
	} else {
		colors = NULL;
	}
	if (parser_hasval(p, "labelcolors")) {
		label_colors = parser_getsym(p, "labelcolors");
		if (streq(label_colors, "*")) {
			label_colors = NULL;
		}
	} else {
		label_colors = NULL;
	}
	if (parser_hasval(p, "symbols")) {
		symbols = parser_getsym(p, "symbols");
	} else {
		symbols = NULL;
	}
	if (ui_entry_renderer_customize(index, colors, label_colors, symbols)) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	return PARSE_ERROR_NONE;
}